

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall
vkb::PhysicalDevice::enable_features_if_present
          (PhysicalDevice *this,VkPhysicalDeviceFeatures *features_to_enable)

{
  bool bVar1;
  long lVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  byte bVar5;
  VkPhysicalDeviceFeatures actual_pdf;
  VkPhysicalDeviceFeatures in_stack_fffffffffffffcf8;
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_228;
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_208;
  undefined1 local_1e8 [220];
  VkPhysicalDeviceFeatures local_10c;
  
  bVar5 = 0;
  memset(&local_10c,0,0xdc);
  (*(code *)detail::vulkan_functions()::v._128_8_)(this->physical_device,&local_10c);
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = detail::supports_features
                    (&local_10c,features_to_enable,(GenericFeatureChain *)&local_208,
                     (GenericFeatureChain *)&local_228);
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base(&local_228);
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base(&local_208);
  if (bVar1) {
    memcpy(local_1e8,features_to_enable,0xdc);
    puVar3 = local_1e8;
    puVar4 = &stack0xfffffffffffffcf8;
    for (lVar2 = 0xdc; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    detail::combine_features(&this->features,in_stack_fffffffffffffcf8);
  }
  return bVar1;
}

Assistant:

bool PhysicalDevice::enable_features_if_present(const VkPhysicalDeviceFeatures& features_to_enable) {
    VkPhysicalDeviceFeatures actual_pdf{};
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(physical_device, &actual_pdf);

    bool required_features_supported = detail::supports_features(actual_pdf, features_to_enable, {}, {});
    if (required_features_supported) {
        detail::combine_features(features, features_to_enable);
    }
    return required_features_supported;
}